

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void find_rectangles(Mat *image,
                    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *rectangles)

{
  pointer pvVar1;
  pointer pPVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int j;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> approx;
  int ch [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Mat gray0;
  Mat blurred;
  Mat gray;
  undefined1 local_408 [16];
  pointer local_3f8;
  _InputArray local_3f0;
  _InputArray local_3d8;
  uint local_3bc;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  undefined1 local_3a8 [8];
  uchar *puStack_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  MatSize local_378;
  size_t *local_370;
  size_t local_368 [2];
  int local_350 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_348;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  _InputArray local_2f0;
  double local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c0;
  long *local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [8];
  pointer pPStack_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  MatSize local_278;
  UMatData *local_270;
  size_t local_268 [2] [2];
  Mat local_248;
  Mat local_1e8;
  undefined1 local_150 [16];
  Size local_140;
  Mat local_f0;
  Mat local_90;
  
  pPStack_2a0 = (pointer)local_2a8;
  local_328 = rectangles;
  cv::Mat::Mat(&local_f0,image);
  local_2a8 = (undefined1  [8])0x0;
  local_2b8 = (long *)CONCAT44(local_2b8._4_4_,0x1010000);
  local_140.width = 0;
  local_140.height = 0;
  local_150._0_4_ = 0x2010000;
  uStack_2b0 = image;
  local_150._8_8_ = &local_f0;
  cv::medianBlur((_InputArray *)&local_2b8,(_OutputArray *)local_150,9);
  local_2c0 = CONCAT44((int)*(undefined8 *)local_f0.size.p,
                       (int)((ulong)*(undefined8 *)local_f0.size.p >> 0x20));
  cv::Mat::Mat((Mat *)local_150,&local_2c0,0);
  cv::Mat::Mat(&local_90);
  local_348.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar11 = 0;
  do {
    local_350[1] = 0;
    local_350[0] = iVar11;
    uVar9 = cv::mixChannels(&local_f0,1,(Mat *)local_150,1,local_350,1);
    uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
    do {
      local_3bc = (uint)uVar9;
      if ((char)uVar9 == '\0') {
        cv::operator>=((Mat *)&local_2b8,255.0);
        (**(code **)(*local_2b8 + 0x18))(local_2b8,(Mat *)&local_2b8,&local_90,0xffffffff);
        cv::Mat::~Mat(&local_1e8);
        cv::Mat::~Mat(&local_248);
        cv::Mat::~Mat((Mat *)local_2a8);
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pPStack_2a0;
        _local_2a8 = auVar4 << 0x40;
        local_2b8 = (long *)CONCAT44(local_2b8._4_4_,0x1010000);
        uStack_2b0 = (Mat *)local_150;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = puStack_3a0;
        _local_3a8 = auVar5 << 0x40;
        local_3b8._0_4_ = 0x2010000;
        uStack_3b0 = &local_90;
        cv::Canny((_InputArray *)&local_2b8,(_OutputArray *)local_3b8,10.0,20.0,3,false);
        local_3f8 = (pointer)0x0;
        local_408._0_4_ = 0x1010000;
        local_408._8_8_ = &local_90;
        local_3d8.sz.width = 0;
        local_3d8.sz.height = 0;
        local_3d8.flags = 0x2010000;
        local_3d8.obj = &local_90;
        cv::Mat::Mat((Mat *)&local_2b8);
        local_3f0.sz.width = 0;
        local_3f0.sz.height = 0;
        local_3f0.flags = 0x1010000;
        local_2f8 = 0xffffffffffffffff;
        local_3b8 = (undefined1  [8])0x7fefffffffffffff;
        uStack_3b0 = (Mat *)0x7fefffffffffffff;
        local_3a8 = (undefined1  [8])0x7fefffffffffffff;
        puStack_3a0 = (uchar *)0x7fefffffffffffff;
        local_3f0.obj = (Mat *)&local_2b8;
        cv::dilate(local_408,&local_3d8,&local_3f0,&local_2f8,1,0,(Mat *)local_3b8);
        cv::Mat::~Mat((Mat *)&local_2b8);
      }
      local_2a8 = (undefined1  [8])0x0;
      local_2b8 = (long *)CONCAT44(local_2b8._4_4_,0x1010000);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = puStack_3a0;
      _local_3a8 = auVar6 << 0x40;
      local_3b8._0_4_ = -0x7dfbfff4;
      uStack_3b0 = (Mat *)&local_348;
      local_300 = 0;
      uStack_2b0 = &local_90;
      cv::findContours((Mat *)&local_2b8,(Mat *)local_3b8,1,2,&local_300);
      local_408 = (undefined1  [16])0x0;
      local_3f8 = (pointer)0x0;
      if (local_348.
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_348.
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar12 = 0;
        do {
          local_2b8 = (long *)0x242ff400c;
          uVar10 = (long)local_348.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_348.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          uStack_2b0 = (Mat *)CONCAT44(1,(int)(uVar10 >> 3));
          local_288 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          pPStack_2a0 = (pointer)0x0;
          local_278.p = (int *)&uStack_2b0;
          local_270 = (UMatData *)local_268;
          local_268[0][0] = 0;
          local_268[0][1] = 0;
          pPVar2 = local_348.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pPVar2 != local_348.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            local_268[0][1] = 8;
            local_268[0][0] = 8;
            local_298._8_8_ =
                 (long)&pPVar2->x + ((long)(uVar10 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U);
            local_298._0_8_ = local_298._8_8_;
            pPStack_2a0 = pPVar2;
          }
          pvVar1 = local_348.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar12;
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x1010000;
          local_3f0.sz.width = 0;
          local_3f0.sz.height = 0;
          local_3f0.flags = -0x7dfcfff4;
          local_3f0.obj = local_408;
          local_3b8 = (undefined1  [8])0x242ff400c;
          uVar10 = (long)(pvVar1->
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar1->
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                         _M_impl.super__Vector_impl_data._M_start;
          uStack_3b0 = (Mat *)CONCAT44(1,(int)(uVar10 >> 3));
          local_388 = (undefined1  [16])0x0;
          local_398 = (undefined1  [16])0x0;
          _local_3a8 = (undefined1  [16])0x0;
          local_370 = local_368;
          local_368[0] = 0;
          local_368[1] = 0;
          pPVar2 = (pvVar1->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pPVar2 != (pvVar1->
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                        _M_impl.super__Vector_impl_data._M_finish) {
            local_368[1] = 8;
            local_368[0] = 8;
            puStack_3a0 = (uchar *)pPVar2;
            local_3a8 = (undefined1  [8])pPVar2;
            local_398._8_8_ =
                 (long)&pPVar2->x + ((long)(uVar10 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U);
            local_398._0_8_ = local_398._8_8_;
          }
          local_2f0.sz.width = 0;
          local_2f0.sz.height = 0;
          local_2f0.flags = 0x1010000;
          local_3d8.obj = (Mat *)&local_2b8;
          local_378.p = (int *)&uStack_3b0;
          local_2f0.obj = (Mat *)local_3b8;
          local_2a8 = (undefined1  [8])pPStack_2a0;
          dVar14 = (double)cv::arcLength(&local_2f0,true);
          cv::approxPolyDP(&local_3d8,(_OutputArray *)&local_3f0,dVar14 * 0.02,true);
          cv::Mat::~Mat((Mat *)local_3b8);
          cv::Mat::~Mat((Mat *)&local_2b8);
          if (local_408._8_8_ - local_408._0_8_ == 0x20) {
            local_2b8 = (long *)0x242ff400c;
            uStack_2b0 = (Mat *)0x100000004;
            local_288 = ZEXT816(0);
            local_298 = ZEXT816(0);
            pPStack_2a0 = (pointer)0x0;
            local_278.p = (int *)&uStack_2b0;
            local_270 = (UMatData *)local_268;
            local_268[0] = (size_t  [2])ZEXT816(0);
            if (local_408._0_8_ != local_408._8_8_) {
              local_268[0][1] = 8;
              local_268[0][0] = 8;
              pPStack_2a0 = (pointer)local_408._0_8_;
              local_298._8_8_ = (pointer)(local_408._0_8_ + 0x20);
              local_298._0_8_ = (pointer)(local_408._0_8_ + 0x20);
            }
            local_3d8.sz.width = 0;
            local_3d8.sz.height = 0;
            local_3d8.flags = 0x1010000;
            local_3d8.obj = (Mat *)&local_2b8;
            local_2a8 = (undefined1  [8])pPStack_2a0;
            dVar14 = (double)cv::contourArea(&local_3d8,false);
            if (ABS(dVar14) <= 1000.0) {
              cv::Mat::~Mat((Mat *)&local_2b8);
            }
            else {
              local_3b8 = (undefined1  [8])0x242ff400c;
              uStack_3b0 = (Mat *)CONCAT44(1,(int)((ulong)(local_408._8_8_ - local_408._0_8_) >> 3))
              ;
              local_388 = ZEXT816(0);
              local_398 = ZEXT816(0);
              _local_3a8 = ZEXT816(0);
              local_370 = local_368;
              local_368 = (size_t  [2])ZEXT816(0);
              if (local_408._8_8_ - local_408._0_8_ != 0) {
                local_368[1] = 8;
                local_368[0] = 8;
                puStack_3a0 = (uchar *)local_408._0_8_;
                local_3a8 = (undefined1  [8])local_408._0_8_;
                local_398._8_8_ =
                     (long)(int *)local_408._0_8_ +
                     ((local_408._8_8_ - local_408._0_8_) * 0x20000000 >> 0x1d & 0xfffffffffffffff8U
                     );
                local_398._0_8_ = local_398._8_8_;
              }
              local_3f0.sz.width = 0;
              local_3f0.sz.height = 0;
              local_3f0.flags = 0x1010000;
              local_3f0.obj = (Mat *)local_3b8;
              local_378.p = (int *)&uStack_3b0;
              cVar7 = cv::isContourConvex(&local_3f0);
              cv::Mat::~Mat((Mat *)local_3b8);
              cv::Mat::~Mat((Mat *)&local_2b8);
              if (cVar7 != '\0') {
                dVar14 = 0.0;
                lVar13 = 2;
                do {
                  uVar8 = (uint)lVar13 & 3;
                  dVar3 = (double)(((pointer)(local_408._0_8_ + (ulong)uVar8 * 8))->x -
                                  ((pointer)(local_408._0_8_ + (lVar13 + -1) * 8))->x);
                  dVar17 = (double)(((pointer)(local_408._0_8_ + (ulong)uVar8 * 8))->y -
                                   ((pointer)(local_408._0_8_ + (lVar13 + -1) * 8))->y);
                  dVar18 = (double)(((pointer)(local_408._0_8_ + (lVar13 + -2) * 8))->x -
                                   ((pointer)(local_408._0_8_ + (lVar13 + -1) * 8))->x);
                  dVar19 = (double)(((pointer)(local_408._0_8_ + (lVar13 + -2) * 8))->y -
                                   ((pointer)(local_408._0_8_ + (lVar13 + -1) * 8))->y);
                  dVar15 = (dVar18 * dVar18 + dVar19 * dVar19) * (dVar3 * dVar3 + dVar17 * dVar17) +
                           1e-10;
                  if (dVar15 < 0.0) {
                    uStack_2d0 = 0;
                    local_320 = dVar19;
                    local_318 = dVar18;
                    local_310 = dVar17;
                    local_308 = dVar14;
                    local_2d8 = dVar3;
                    dVar15 = sqrt(dVar15);
                    dVar16 = local_308;
                    dVar17 = local_310;
                    dVar18 = local_318;
                    dVar19 = local_320;
                    dVar3 = local_2d8;
                  }
                  else {
                    dVar15 = SQRT(dVar15);
                    dVar16 = dVar14;
                  }
                  dVar14 = ABS((dVar3 * dVar18 + dVar17 * dVar19) / dVar15);
                  if (dVar14 <= dVar16) {
                    dVar14 = dVar16;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 5);
                if (dVar14 < 0.3) {
                  std::
                  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ::push_back(local_328,(value_type *)local_408);
                }
              }
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(((long)local_348.
                                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_348.
                                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
        if ((pointer)local_408._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_408._0_8_,(long)local_3f8 - local_408._0_8_);
        }
      }
      uVar9 = 0;
    } while ((local_3bc & 1) != 0);
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_348);
  cv::Mat::~Mat(&local_90);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat(&local_f0);
  return;
}

Assistant:

void find_rectangles(Mat& image, vector<vector<Point> >& rectangles)
{
    // blur will enhance edge detection
    Mat blurred(image);
    medianBlur(image, blurred, 9);

    Mat gray0(blurred.size(), CV_8U), gray;
    vector<vector<Point>> contours;

    // find rectangles in every color plane of the image
    for (int c = 0; c < 3; c++)
    {
        int ch[] = {c, 0};
        mixChannels(&blurred, 1, &gray0, 1, ch, 1);

        // try several threshold levels
        const int threshold_level = 2;
        for (int l = 0; l < threshold_level; l++)
        {
            // Use Canny instead of zero threshold level!
            // Canny helps to catch rectangles with gradient shading
            if (l == 0)
            {
                Canny(gray0, gray, 10, 20, 3); //
                // Dilate helps to remove potential holes between edge segments
                dilate(gray, gray, Mat(), Point(-1,-1));
            }
            else
            {
                    gray = gray0 >= (l+1) * 255 / threshold_level;
            }

            // Find contours and store them in a list
            findContours(gray, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

            // Test contours
            vector<Point> approx;
            for (size_t i = 0; i < contours.size(); i++)
            {
                    // approximate contour with accuracy proportional
                    // to the contour perimeter
                    approxPolyDP(Mat(contours[i]), approx, arcLength(Mat(contours[i]), true)*0.02, true);

                    // Note: absolute value of an area is used because
                    // area may be positive or negative - in accordance with the
                    // contour orientation
                    if (approx.size() == 4 &&
                            fabs(contourArea(Mat(approx))) > 1000 &&
                            isContourConvex(Mat(approx)))
                    {
                            double maxCosine = 0;

                            for (int j = 2; j < 5; j++)
                            {
                                    double cosine = fabs(angle(approx[j%4], approx[j-2], approx[j-1]));
                                    maxCosine = MAX(maxCosine, cosine);
                            }

                            if (maxCosine < 0.3)
                              rectangles.push_back(approx);
                    }
            }
        }
    }
}